

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_value_utils.h
# Opt level: O0

bool Gudhi::intersect_lifetimes<float>(float *f1,float *f2)

{
  uint uVar1;
  int iVar2;
  float *f2_local;
  float *f1_local;
  
  uVar1 = std::isnan((double)(ulong)(uint)*f1);
  if ((uVar1 & 1) == 0) {
    if (*f1 < *f2) {
      *f1 = *f2;
      f1_local._7_1_ = true;
    }
    else {
      f1_local._7_1_ = false;
    }
  }
  else {
    *f1 = *f2;
    iVar2 = std::isnan((double)(ulong)(uint)*f2);
    f1_local._7_1_ = (bool)(((byte)iVar2 ^ 0xff) & 1);
  }
  return f1_local._7_1_;
}

Assistant:

bool intersect_lifetimes(Arithmetic_filtration_value& f1, const Arithmetic_filtration_value& f2)
{
  if constexpr (std::numeric_limits<Arithmetic_filtration_value>::has_quiet_NaN) {
    if (std::isnan(f1)) {
      f1 = f2;
      return !std::isnan(f2);
    }

    // Computes the max while handling NaN as lowest value.
    if (!(f1 < f2)) return false;

    f1 = f2;
    return true;
  } else {
    // NaN not possible.
    if (f1 < f2){
      f1 = f2;
      return true;
    }
    return false;
  }
}